

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::CopyADirectory(string *source,string *destination,bool always)

{
  bool bVar1;
  int iVar2;
  unsigned_long uVar3;
  char *pcVar4;
  undefined1 local_88 [8];
  string fullDestPath;
  string fullPath;
  size_t fileNum;
  Directory local_30;
  Directory dir;
  bool always_local;
  string *destination_local;
  string *source_local;
  
  dir.Internal._7_1_ = always;
  Directory::Directory(&local_30);
  bVar1 = Directory::Load(&local_30,source);
  if (bVar1) {
    bVar1 = MakeDirectory(destination,(mode_t *)0x0);
    if (bVar1) {
      for (fullPath.field_2._8_8_ = 0; uVar3 = Directory::GetNumberOfFiles(&local_30),
          (ulong)fullPath.field_2._8_8_ < uVar3; fullPath.field_2._8_8_ = fullPath.field_2._8_8_ + 1
          ) {
        pcVar4 = Directory::GetFile(&local_30,fullPath.field_2._8_8_);
        iVar2 = strcmp(pcVar4,".");
        if (iVar2 != 0) {
          pcVar4 = Directory::GetFile(&local_30,fullPath.field_2._8_8_);
          iVar2 = strcmp(pcVar4,"..");
          if (iVar2 != 0) {
            std::__cxx11::string::string
                      ((string *)(fullDestPath.field_2._M_local_buf + 8),(string *)source);
            std::__cxx11::string::operator+=((string *)(fullDestPath.field_2._M_local_buf + 8),"/");
            pcVar4 = Directory::GetFile(&local_30,fullPath.field_2._8_8_);
            std::__cxx11::string::operator+=
                      ((string *)(fullDestPath.field_2._M_local_buf + 8),pcVar4);
            bVar1 = FileIsDirectory((string *)((long)&fullDestPath.field_2 + 8));
            if (bVar1) {
              std::__cxx11::string::string((string *)local_88,(string *)destination);
              std::__cxx11::string::operator+=((string *)local_88,"/");
              pcVar4 = Directory::GetFile(&local_30,fullPath.field_2._8_8_);
              std::__cxx11::string::operator+=((string *)local_88,pcVar4);
              bVar1 = CopyADirectory((string *)((long)&fullDestPath.field_2 + 8),(string *)local_88,
                                     (bool)(dir.Internal._7_1_ & 1));
              if (!bVar1) {
                source_local._7_1_ = 0;
              }
              bVar1 = !bVar1;
              std::__cxx11::string::~string((string *)local_88);
              if (!bVar1) goto LAB_001479c5;
            }
            else {
              bVar1 = CopyAFile((string *)((long)&fullDestPath.field_2 + 8),destination,
                                (bool)(dir.Internal._7_1_ & 1));
              if (bVar1) {
LAB_001479c5:
                bVar1 = false;
              }
              else {
                source_local._7_1_ = 0;
                bVar1 = true;
              }
            }
            std::__cxx11::string::~string((string *)(fullDestPath.field_2._M_local_buf + 8));
            if (bVar1) goto LAB_00147a09;
          }
        }
      }
      source_local._7_1_ = 1;
    }
    else {
      source_local._7_1_ = 0;
    }
  }
  else {
    source_local._7_1_ = 0;
  }
LAB_00147a09:
  Directory::~Directory(&local_30);
  return (bool)(source_local._7_1_ & 1);
}

Assistant:

bool SystemTools::CopyADirectory(const std::string& source,
                                 const std::string& destination, bool always)
{
  Directory dir;
  if (dir.Load(source) == 0) {
    return false;
  }
  size_t fileNum;
  if (!SystemTools::MakeDirectory(destination)) {
    return false;
  }
  for (fileNum = 0; fileNum < dir.GetNumberOfFiles(); ++fileNum) {
    if (strcmp(dir.GetFile(static_cast<unsigned long>(fileNum)), ".") &&
        strcmp(dir.GetFile(static_cast<unsigned long>(fileNum)), "..")) {
      std::string fullPath = source;
      fullPath += "/";
      fullPath += dir.GetFile(static_cast<unsigned long>(fileNum));
      if (SystemTools::FileIsDirectory(fullPath)) {
        std::string fullDestPath = destination;
        fullDestPath += "/";
        fullDestPath += dir.GetFile(static_cast<unsigned long>(fileNum));
        if (!SystemTools::CopyADirectory(fullPath, fullDestPath, always)) {
          return false;
        }
      } else {
        if (!SystemTools::CopyAFile(fullPath, destination, always)) {
          return false;
        }
      }
    }
  }

  return true;
}